

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_Nonlin4Reorder(DdManager *dd,int fTwice,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  abctime time;
  DdManager *pDVar5;
  
  aVar3 = Abc_Clock();
  if (fVerbose == 0) {
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    if (fTwice == 0) {
      return;
    }
  }
  else {
    uVar1 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print((int)pDVar5,"Reordering... Before =%5d. ",(ulong)(uVar1 - uVar2));
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    uVar1 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print((int)pDVar5,"After =%5d. ",(ulong)(uVar1 - uVar2));
    if (fTwice == 0) goto LAB_0066ec0c;
  }
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
  if (fVerbose == 0) {
    return;
  }
  uVar1 = Cudd_ReadKeys(dd);
  uVar2 = Cudd_ReadDead(dd);
  Abc_Print((int)dd,"After =%5d. ",(ulong)(uVar1 - uVar2));
LAB_0066ec0c:
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x77b9b0,(char *)(aVar4 - aVar3),time);
  return;
}

Assistant:

void Llb_Nonlin4Reorder( DdManager * dd, int fTwice, int fVerbose )
{
    abctime clk = Abc_Clock();
    if ( fVerbose )
        Abc_Print( 1, "Reordering... Before =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
        Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    if ( fTwice )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose )
            Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}